

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbitlib.c
# Opt level: O2

int b_arshift(lua_State *L)

{
  ulong r;
  ulong uVar1;
  ulong n;
  
  r = luaL_checkinteger(L,1);
  uVar1 = luaL_checkinteger(L,2);
  if ((int)r < 0 && -1 < (long)uVar1) {
    n = 0xffffffff;
    if (uVar1 < 0x20) {
      n = (ulong)((uint)(r >> (uVar1 & 0x3f)) | (uint)(-0x100000000 >> (uVar1 & 0x3f)));
    }
    lua_pushinteger(L,n);
  }
  else {
    b_shift(L,r,-uVar1);
  }
  return 1;
}

Assistant:

static int b_arshift (lua_State *L) {
  lua_Unsigned r = checkunsigned(L, 1);
  lua_Integer i = luaL_checkinteger(L, 2);
  if (i < 0 || !(r & ((lua_Unsigned)1 << (LUA_NBITS - 1))))
    return b_shift(L, r, -i);
  else {  /* arithmetic shift for 'negative' number */
    if (i >= LUA_NBITS) r = ALLONES;
    else
      r = trim((r >> i) | ~(trim(~(lua_Unsigned)0) >> i));  /* add signal bit */
    pushunsigned(L, r);
    return 1;
  }
}